

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini_tree_builder.h
# Opt level: O3

vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
* __thiscall
bvh::v2::MiniTreeBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_unsigned_int>::prune_mini_trees
          (vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
           *__return_storage_ptr__,
          MiniTreeBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_unsigned_int> *this,
          vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
          *mini_trees)

{
  ulong uVar1;
  pointer pBVar2;
  pointer pNVar3;
  float fVar4;
  float fVar5;
  undefined1 auVar6 [16];
  ulong uVar7;
  ulong uVar8;
  pointer pBVar9;
  size_type __n;
  ulong end;
  vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
  *pvVar10;
  float *pfVar11;
  pointer pBVar12;
  ThreadPool *pTVar13;
  float fVar14;
  undefined1 in_XMM5 [16];
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  pruned_roots;
  value_type node_id;
  stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> stack;
  unique_lock<std::mutex> local_118;
  _Any_data local_108;
  code *pcStack_f8;
  code *pcStack_f0;
  vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
  *local_e8;
  long local_e0;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_d8;
  anon_class_24_3_47abbb90 local_b8;
  vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
  *local_a0;
  MiniTreeBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_unsigned_int> *local_98;
  pointer local_90;
  undefined1 local_88 [16];
  _Elt_pointer puStack_78;
  undefined1 auStack_70 [24];
  _Elt_pointer puStack_58;
  _Elt_pointer puStack_50;
  _Elt_pointer puStack_48;
  _Map_pointer ppuStack_40;
  
  pBVar12 = (mini_trees->
            super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pBVar2 = (mini_trees->
           super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  fVar14 = 0.0;
  pBVar9 = pBVar12;
  while (pBVar9 != pBVar2) {
    pNVar3 = (pBVar9->nodes).
             super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pBVar9 = pBVar9 + 1;
    fVar4 = *(float *)((long)(pNVar3->bounds)._M_elems + 4) - (pNVar3->bounds)._M_elems[0];
    fVar5 = *(float *)((long)(pNVar3->bounds)._M_elems + 0xc) -
            *(float *)((long)(pNVar3->bounds)._M_elems + 8);
    auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * fVar5)),
                             ZEXT416((uint)(*(float *)((long)(pNVar3->bounds)._M_elems + 0x14) -
                                           *(float *)((long)(pNVar3->bounds)._M_elems + 0x10))),
                             ZEXT416((uint)(fVar4 + fVar5)));
    fVar14 = fVar14 + auVar6._0_4_;
  }
  __n = 0;
  auVar6 = vcvtusi2ss_avx512f(in_XMM5,((long)pBVar2 - (long)pBVar12 >> 4) * -0x5555555555555555);
  local_e0 = CONCAT44(local_e0._4_4_,(fVar14 / auVar6._0_4_) * this->config_->pruning_area_ratio);
  puStack_48 = (_Elt_pointer)0x0;
  ppuStack_40 = (_Map_pointer)0x0;
  local_88._12_4_ = 0;
  local_88._0_12_ = ZEXT812(0);
  puStack_78 = (_Elt_pointer)0x0;
  auStack_70 = (undefined1  [24])0x0;
  puStack_58 = (_Elt_pointer)0x0;
  puStack_50 = (_Elt_pointer)0x0;
  std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_initialize_map
            ((_Deque_base<unsigned_long,_std::allocator<unsigned_long>_> *)local_88,0);
  local_d8.
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._0_16_ = ZEXT816(0) << 0x40;
  local_d8.
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_108._M_unused._M_object = (mutex *)0x0;
  local_e8 = __return_storage_ptr__;
  if ((mini_trees->
      super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (mini_trees->
      super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    local_a0 = mini_trees;
    local_98 = this;
    do {
      pvVar10 = local_a0;
      local_b8.pruned_roots =
           (vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            *)0x0;
      std::deque<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)local_88,
                 (unsigned_long *)&local_b8);
      pBVar12 = (pvVar10->
                super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if (puStack_58 != puStack_78) {
        pBVar12 = pBVar12 + local_108._M_unused._M_member_pointer;
        local_90 = pBVar12;
        do {
          if (puStack_58 == puStack_50) {
            local_b8.pruned_roots =
                 (vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  *)ppuStack_40[-1][0x3f];
            pfVar11 = (float *)((long)local_b8.pruned_roots * 0x1c +
                               *(long *)&(pBVar12->nodes).
                                         super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                                         ._M_impl);
            operator_delete(puStack_50,0x200);
            puStack_50 = ppuStack_40[-1];
            puStack_48 = puStack_50 + 0x40;
            puStack_58 = puStack_50 + 0x3f;
            ppuStack_40 = ppuStack_40 + -1;
          }
          else {
            local_b8.pruned_roots =
                 (vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  *)puStack_58[-1];
            puStack_58 = puStack_58 + -1;
            pfVar11 = (float *)((long)local_b8.pruned_roots * 0x1c +
                               *(long *)&(pBVar12->nodes).
                                         super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                                         ._M_impl);
          }
          auVar6 = vfmadd231ss_fma(ZEXT416((uint)((pfVar11[1] - *pfVar11) *
                                                 (pfVar11[3] - pfVar11[2]))),
                                   ZEXT416((uint)(pfVar11[5] - pfVar11[4])),
                                   ZEXT416((uint)((pfVar11[1] - *pfVar11) +
                                                 (pfVar11[3] - pfVar11[2]))));
          if ((auVar6._0_4_ < (float)local_e0) || (((uint)pfVar11[6] & 0xf) != 0)) {
            std::
            vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
            ::emplace_back<unsigned_long&,unsigned_long&>
                      ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                        *)&local_d8,(unsigned_long *)local_108._M_pod_data,
                       (unsigned_long *)&local_b8);
          }
          else {
            local_118._M_device = (mutex_type *)(ulong)((uint)pfVar11[6] >> 4);
            std::deque<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                      ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)local_88,
                       (unsigned_long *)&local_118);
            local_118._M_device = (mutex_type *)((ulong)((uint)pfVar11[6] >> 4) + 1);
            std::deque<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                      ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)local_88,
                       (unsigned_long *)&local_118);
            pBVar12 = local_90;
          }
        } while (puStack_58 != puStack_78);
        pBVar12 = (local_a0->
                  super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
      }
      local_108._M_unused._0_8_ =
           (undefined8)
           ((long)&(((mutex *)local_108._M_unused._0_8_)->super___mutex_base)._M_mutex + 1);
    } while (local_108._M_unused._M_object <
             (undefined1 *)
             (((long)(local_a0->
                     super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pBVar12 >> 4) *
             -0x5555555555555555));
    __n = (long)local_d8.
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_d8.
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 4;
    this = local_98;
    mini_trees = local_a0;
  }
  pvVar10 = local_e8;
  std::
  vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
  ::vector(local_e8,__n,(allocator_type *)local_108._M_pod_data);
  local_b8.pruned_roots = &local_d8;
  end = (long)local_d8.
              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_d8.
              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 4;
  local_b8.pruned_trees = pvVar10;
  local_b8.mini_trees = mini_trees;
  if (end < (this->executor_).parallel_threshold) {
    prune_mini_trees::anon_class_24_3_47abbb90::operator()(&local_b8,0,end);
  }
  else {
    pTVar13 = (this->executor_).thread_pool;
    uVar7 = end / (ulong)((long)(pTVar13->threads_).
                                super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)(pTVar13->threads_).
                                super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 3);
    local_e0 = uVar7 + (uVar7 == 0);
    if (local_d8.
        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_d8.
        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar7 = 0;
      do {
        pTVar13 = (this->executor_).thread_pool;
        local_108._M_unused._M_object = (void *)0x0;
        local_108._8_8_ = 0;
        pcStack_f8 = (code *)0x0;
        pcStack_f0 = (code *)0x0;
        local_108._M_unused._M_object = operator_new(0x28);
        uVar1 = uVar7 + local_e0;
        *(vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
          **)((long)local_108._M_unused._0_8_ + 0x10) = local_b8.mini_trees;
        uVar8 = end;
        if (uVar1 < end) {
          uVar8 = uVar1;
        }
        *(vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          **)local_108._M_unused._0_8_ = local_b8.pruned_roots;
        *(vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
          **)((long)local_108._M_unused._0_8_ + 8) = local_b8.pruned_trees;
        *(ulong *)((long)local_108._M_unused._0_8_ + 0x18) = uVar7;
        *(ulong *)((long)local_108._M_unused._0_8_ + 0x20) = uVar8;
        pcStack_f0 = std::
                     _Function_handler<void_(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/executor.h:58:30)>
                     ::_M_invoke;
        local_118._M_device = &pTVar13->mutex_;
        pcStack_f8 = std::
                     _Function_handler<void_(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/executor.h:58:30)>
                     ::_M_manager;
        local_118._M_owns = false;
        std::unique_lock<std::mutex>::lock(&local_118);
        local_118._M_owns = true;
        std::
        deque<std::function<void(unsigned_long)>,std::allocator<std::function<void(unsigned_long)>>>
        ::emplace_back<std::function<void(unsigned_long)>>
                  ((deque<std::function<void(unsigned_long)>,std::allocator<std::function<void(unsigned_long)>>>
                    *)&pTVar13->tasks_,(function<void_(unsigned_long)> *)&local_108);
        std::unique_lock<std::mutex>::~unique_lock(&local_118);
        std::condition_variable::notify_one();
        if (pcStack_f8 != (code *)0x0) {
          (*pcStack_f8)(&local_108,&local_108,__destroy_functor);
        }
        uVar7 = uVar1;
      } while (uVar1 < end);
      pTVar13 = (this->executor_).thread_pool;
      pvVar10 = local_e8;
    }
    local_108._M_unused._M_object = &pTVar13->mutex_;
    local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
    std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&local_108);
    local_108._M_pod_data[8] = 1;
    while ((pTVar13->busy_count_ != 0 ||
           (((iterator *)
            ((long)&(pTVar13->tasks_).c.
                    super__Deque_base<std::function<void_(unsigned_long)>,_std::allocator<std::function<void_(unsigned_long)>_>_>
                    ._M_impl.super__Deque_impl_data + 0x30))->_M_cur !=
            ((iterator *)
            ((long)&(pTVar13->tasks_).c.
                    super__Deque_base<std::function<void_(unsigned_long)>,_std::allocator<std::function<void_(unsigned_long)>_>_>
                    ._M_impl.super__Deque_impl_data + 0x10))->_M_cur))) {
      std::condition_variable::wait((unique_lock *)&pTVar13->done_);
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&local_108);
  }
  if (local_d8.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_d8.
                          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.
                          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base
            ((_Deque_base<unsigned_long,_std::allocator<unsigned_long>_> *)local_88);
  return pvVar10;
}

Assistant:

std::vector<Bvh<Node>> prune_mini_trees(std::vector<Bvh<Node>>&& mini_trees) {
        // Compute the area threshold based on the area of the entire set of primitives
        auto avg_area = static_cast<Scalar>(0.);
        for (auto& mini_tree : mini_trees)
            avg_area += mini_tree.get_root().get_bbox().get_half_area();
        avg_area /= static_cast<Scalar>(mini_trees.size());
        auto threshold = avg_area * config_.pruning_area_ratio;

        // Cull nodes whose area is above the threshold
        std::stack<size_t> stack;
        std::vector<std::pair<size_t, size_t>> pruned_roots;
        for (size_t i = 0; i < mini_trees.size(); ++i) {
            stack.push(0);
            auto& mini_tree = mini_trees[i];
            while (!stack.empty()) {
                auto node_id = stack.top();
                auto& node = mini_tree.nodes[node_id];
                stack.pop();
                if (node.get_bbox().get_half_area() < threshold || node.is_leaf()) {
                    pruned_roots.emplace_back(i, node_id);
                } else {
                    stack.push(node.index.first_id());
                    stack.push(node.index.first_id() + 1);
                }
            }
        }

        // Extract the BVHs rooted at the previously computed indices
        std::vector<Bvh<Node>> pruned_trees(pruned_roots.size());
        executor_.for_each(0, pruned_roots.size(),
            [&] (size_t begin, size_t end) {
                for (size_t i = begin; i < end; ++i) {
                    if (pruned_roots[i].second == 0)
                        pruned_trees[i] = std::move(mini_trees[pruned_roots[i].first]);
                    else
                        pruned_trees[i] = mini_trees[pruned_roots[i].first]
                            .extract_bvh(pruned_roots[i].second);
                }
            });
        return pruned_trees;
    }